

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadHelperWiAngleProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *file;
  char local_428 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Wi-Angle-Helper-Program}\n");
  fflush(_stdout);
  djgp_push_string(program_00,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  djgp_push_string(program_00,"#define VERTEX_CNT %i\n",(ulong)(uint)g_sphere.circles.vertexCnt);
  file = strcat2(local_428,g_app.dir.shader,"wi_angle.glsl");
  djgp_push_file(program_00,file);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs + 6);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[0xd] = (*glad_glGetUniformLocation)(g_gl.programs[6],"u_Dir");
    configureHelperWiAngleProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadHelperWiAngleProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_HELPER_WI_ANGLE];
    char buf[1024];

    LOG("Loading {Wi-Angle-Helper-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_string(djp, "#define VERTEX_CNT %i\n", g_sphere.circles.vertexCnt);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "wi_angle.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_HELPER_WI_ANGLE_DIR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_HELPER_WI_ANGLE], "u_Dir");

    configureHelperWiAngleProgram();

    return (glGetError() == GL_NO_ERROR);
}